

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

size_t __thiscall
CDBWrapper::EstimateSize<unsigned_char>(CDBWrapper *this,uchar *key_begin,uchar *key_end)

{
  size_t sVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key1;
  Span<const_std::byte> key2;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_68;
  long lStack_50;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_48;
  long lStack_30;
  uchar local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_30 = 0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_50 = 0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_48,0x40);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_68,lStack_50 + 0x40)
  ;
  local_21 = *key_begin;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_48,
             local_48._M_impl.super__Vector_impl_data._M_finish,&local_21);
  local_21 = *key_end;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_68,
             local_68._M_impl.super__Vector_impl_data._M_finish,&local_21);
  key1.m_data = local_48._M_impl.super__Vector_impl_data._M_start + lStack_30;
  key1.m_size = (long)local_48._M_impl.super__Vector_impl_data._M_finish - (long)key1.m_data;
  key2.m_data = local_68._M_impl.super__Vector_impl_data._M_start + lStack_50;
  key2.m_size = (long)local_68._M_impl.super__Vector_impl_data._M_finish - (long)key2.m_data;
  sVar1 = EstimateSizeImpl(this,key1,key2);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_68);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t EstimateSize(const K& key_begin, const K& key_end) const
    {
        DataStream ssKey1{}, ssKey2{};
        ssKey1.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey2.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey1 << key_begin;
        ssKey2 << key_end;
        return EstimateSizeImpl(ssKey1, ssKey2);
    }